

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  int iVar1;
  Rtree *pRVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  Rtree *in_RDI;
  long in_FS_OFFSET;
  RtreeValue RVar3;
  int jj;
  sqlite3_stmt *pUp;
  int rc2;
  int steprc;
  int nn;
  int ii;
  int bHaveRowid;
  int rc;
  Rtree *pRtree;
  RtreeNode *pLeaf;
  RtreeCell cell;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Rtree *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Rtree *in_stack_ffffffffffffff70;
  sqlite3_stmt *pStmt;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int iVar4;
  int iCol;
  Rtree *ppLeaf;
  int in_stack_ffffffffffffffbc;
  RtreeCell *pCell;
  Rtree *in_stack_ffffffffffffffc8;
  RtreeValue aRStack_30 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iCol = 0;
  ppLeaf = in_RDI;
  memcpy(&stack0xffffffffffffffc8,&DAT_002b0fa8,0x30);
  iVar4 = 0;
  if (in_RDI->nNodeRef != 0) {
    iCol = 0x206;
    goto LAB_00298936;
  }
  rtreeReference(in_RDI);
  memset(&stack0xffffffffffffffc8,0,0x30);
  if (in_ESI < 2) {
LAB_0029877a:
    iVar1 = sqlite3_value_type((sqlite3_value *)*in_RDX);
    pRVar2 = in_RDI;
    if (iVar1 != 5) {
      sqlite3_value_int64((sqlite3_value *)0x2987a3);
      iCol = rtreeDeleteRowid((Rtree *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                              ,(sqlite3_int64)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff60 = in_RDI;
    }
    if ((iCol == 0) && (1 < in_ESI)) {
      pCell = (RtreeCell *)0x0;
      if (iVar4 == 0) {
        iCol = rtreeNewRowid(in_stack_ffffffffffffff60,
                             (i64 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      *in_RCX = in_stack_ffffffffffffffc8;
      if (iCol == 0) {
        iCol = ChooseLeaf(in_stack_ffffffffffffffc8,pCell,in_stack_ffffffffffffffbc,
                          (RtreeNode **)ppLeaf);
      }
      if (iCol == 0) {
        iCol = rtreeInsertCell(in_stack_ffffffffffffff70,
                               (RtreeNode *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               (RtreeCell *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        iVar1 = nodeRelease(in_stack_ffffffffffffff60,
                            (RtreeNode *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        if (iCol == 0) {
          iCol = iVar1;
        }
      }
      if ((iCol == 0) && (pRVar2->nAux != '\0')) {
        pStmt = pRVar2->pWriteAux;
        sqlite3_bind_int64(pStmt,-0x55555556,(sqlite_int64)in_stack_ffffffffffffff60);
        for (iVar1 = 0; iVar1 < (int)(uint)pRVar2->nAux; iVar1 = iVar1 + 1) {
          sqlite3_bind_value((sqlite3_stmt *)pRVar2,iCol,
                             (sqlite3_value *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
        sqlite3_step((sqlite3_stmt *)CONCAT44(iCol,iVar4));
        iCol = sqlite3_reset(pStmt);
      }
    }
  }
  else {
    in_stack_ffffffffffffff80 = in_ESI - 4;
    if ((int)(uint)in_RDI->nDim2 < (int)in_stack_ffffffffffffff80) {
      in_stack_ffffffffffffff80 = (uint)in_RDI->nDim2;
    }
    if (in_RDI->eCoordType == '\0') {
      for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < (int)in_stack_ffffffffffffff80
          ; in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 2) {
        RVar3 = rtreeValueDown((sqlite3_value *)in_stack_ffffffffffffff60);
        aRStack_30[in_stack_ffffffffffffff84] = RVar3;
        RVar3 = rtreeValueUp((sqlite3_value *)in_stack_ffffffffffffff60);
        aRStack_30[in_stack_ffffffffffffff84 + 1] = RVar3;
        if (aRStack_30[in_stack_ffffffffffffff84 + 1] <= aRStack_30[in_stack_ffffffffffffff84] &&
            aRStack_30[in_stack_ffffffffffffff84] != aRStack_30[in_stack_ffffffffffffff84 + 1]) {
          iCol = rtreeConstraintError(in_RDI,iCol);
          goto LAB_00298924;
        }
      }
    }
    else {
      for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < (int)in_stack_ffffffffffffff80
          ; in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 2) {
        RVar3 = (RtreeValue)sqlite3_value_int((sqlite3_value *)0x29860a);
        aRStack_30[in_stack_ffffffffffffff84] = RVar3;
        RVar3 = (RtreeValue)sqlite3_value_int((sqlite3_value *)0x29862d);
        aRStack_30[in_stack_ffffffffffffff84 + 1] = RVar3;
        if ((int)aRStack_30[in_stack_ffffffffffffff84 + 1] <
            (int)aRStack_30[in_stack_ffffffffffffff84]) {
          iCol = rtreeConstraintError(in_RDI,iCol);
          goto LAB_00298924;
        }
      }
    }
    iVar1 = sqlite3_value_type((sqlite3_value *)in_RDX[2]);
    if (iVar1 == 5) goto LAB_0029877a;
    in_stack_ffffffffffffffc8 = (Rtree *)sqlite3_value_int64((sqlite3_value *)0x2986a8);
    iVar1 = sqlite3_value_type((sqlite3_value *)*in_RDX);
    if ((iVar1 != 5) &&
       (pRVar2 = (Rtree *)sqlite3_value_int64((sqlite3_value *)0x2986cc),
       pRVar2 == in_stack_ffffffffffffffc8)) {
LAB_00298770:
      iVar4 = 1;
      goto LAB_0029877a;
    }
    sqlite3_bind_int64((sqlite3_stmt *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                       (sqlite_int64)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff7c = sqlite3_step((sqlite3_stmt *)CONCAT44(iCol,iVar4));
    iCol = sqlite3_reset((sqlite3_stmt *)in_stack_ffffffffffffff70);
    if (in_stack_ffffffffffffff7c != 100) goto LAB_00298770;
    iVar4 = sqlite3_vtab_on_conflict(in_RDI->db);
    if (iVar4 == 5) {
      iCol = rtreeDeleteRowid((Rtree *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                              ,(sqlite3_int64)in_stack_ffffffffffffff70);
      goto LAB_00298770;
    }
    iCol = rtreeConstraintError(in_RDI,iCol);
  }
LAB_00298924:
  rtreeRelease((Rtree *)0x29892e);
LAB_00298936:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iCol;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab,
  int nData,
  sqlite3_value **aData,
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  memset(&cell, 0, sizeof(cell));

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;
    int nn = nData - 4;

    if( nn > pRtree->nDim2 ) nn = pRtree->nDim2;
    /* Populate the cell.aCoord[] array. The first coordinate is aData[3].
    **
    ** NB: nData can only be less than nDim*2+3 if the rtree is mis-declared
    ** with "column" that are interpreted as table constraints.
    ** Example:  CREATE VIRTUAL TABLE bad USING rtree(x,y,CHECK(y>5));
    ** This problem was discovered after years of use, so we silently ignore
    ** these kinds of misdeclared tables to avoid breaking any legacy.
    */

#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(aData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(aData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(aData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(aData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(aData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(aData[2]);
      if( sqlite3_value_type(aData[0])==SQLITE_NULL
       || sqlite3_value_int64(aData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = rtreeConstraintError(pRtree, 0);
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(aData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(aData[0]));
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
    if( rc==SQLITE_OK && pRtree->nAux ){
      sqlite3_stmt *pUp = pRtree->pWriteAux;
      int jj;
      sqlite3_bind_int64(pUp, 1, *pRowid);
      for(jj=0; jj<pRtree->nAux; jj++){
        sqlite3_bind_value(pUp, jj+2, aData[pRtree->nDim2+3+jj]);
      }
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}